

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::CompareOperator<float>::doPrint
          (CompareOperator<float> *this,ostream *os,BaseArgExprs *args)

{
  ostream *poVar1;
  const_reference ppEVar2;
  string local_40 [32];
  vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
  *local_20;
  BaseArgExprs *args_local;
  ostream *os_local;
  CompareOperator<float> *this_local;
  
  local_20 = args;
  args_local = (BaseArgExprs *)os;
  os_local = (ostream *)this;
  poVar1 = std::operator<<(os,"(");
  ppEVar2 = std::
            vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
            ::operator[](local_20,0);
  poVar1 = BuiltinPrecisionTests::operator<<(poVar1,*ppEVar2);
  (**(code **)(*(long *)this + 0x58))();
  poVar1 = std::operator<<(poVar1,local_40);
  ppEVar2 = std::
            vector<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
            ::operator[](local_20,1);
  poVar1 = BuiltinPrecisionTests::operator<<(poVar1,*ppEVar2);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void			doPrint	(ostream& os, const BaseArgExprs& args) const
	{
		os << "(" << *args[0] << getSymbol() << *args[1] << ")";
	}